

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O3

void WebRtcNs_ProcessCore
               (NoiseSuppressionC *self,float **speechFrame,size_t num_bands,float **outFrame)

{
  ulong uVar1;
  int iVar2;
  float *pfVar3;
  size_t i;
  long lVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  float (*pafVar9) [256];
  ulong uVar10;
  float **ppfVar11;
  float **ppfVar12;
  uint uVar13;
  double dVar14;
  float energy;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float winData [256];
  float imag [129];
  float theFilter [129];
  float magn [129];
  float fout [160];
  float real [256];
  uint local_1104;
  float local_10e8 [256];
  float local_ce8 [132];
  float afStack_ad8 [132];
  float local_8c8 [132];
  float local_6b8 [159];
  float afStack_43c [259];
  
  if (self->initFlag != 1) {
    __assert_fail("self->initFlag == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                  ,0x4b9,
                  "void WebRtcNs_ProcessCore(NoiseSuppressionC *, const float *const *, size_t, float *const *)"
                 );
  }
  uVar1 = num_bands - 1;
  if (2 < uVar1) {
    __assert_fail("(num_bands - 1) <= NUM_HIGH_BANDS_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                  ,0x4ba,
                  "void WebRtcNs_ProcessCore(NoiseSuppressionC *, const float *const *, size_t, float *const *)"
                 );
  }
  if (num_bands < 2) {
    local_1104 = 1;
    ppfVar11 = (float **)0x0;
    ppfVar12 = (float **)0x0;
  }
  else {
    ppfVar11 = speechFrame + 1;
    ppfVar12 = outFrame + 1;
    iVar2 = (int)self->magnLen;
    iVar6 = iVar2 + 3;
    if (-1 < iVar2) {
      iVar6 = iVar2;
    }
    local_1104 = iVar6 >> 2;
  }
  UpdateBuffer(*speechFrame,self->blockLen,self->anaLen,self->dataBuf);
  if (1 < num_bands) {
    pafVar9 = self->dataBufHB;
    uVar10 = 0;
    do {
      UpdateBuffer(ppfVar11[uVar10],self->blockLen,self->anaLen,*pafVar9);
      uVar10 = uVar10 + 1;
      pafVar9 = pafVar9 + 1;
    } while (uVar1 != uVar10);
  }
  uVar10 = self->anaLen;
  if (uVar10 != 0) {
    pfVar3 = self->window;
    uVar7 = 0;
    do {
      local_10e8[uVar7] = pfVar3[uVar7] * self->dataBuf[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar10 != uVar7);
    fVar15 = 0.0;
    uVar7 = 0;
    do {
      fVar15 = fVar15 + local_10e8[uVar7] * local_10e8[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar10 != uVar7);
    if ((fVar15 != 0.0) || (NAN(fVar15))) {
      FFT(self,local_10e8,uVar10,self->magnLen,afStack_43c + 1,local_ce8,local_8c8);
      iVar2 = self->blockInd;
      sVar5 = self->magnLen;
      if (iVar2 < 0x32) {
        if (sVar5 != 0) {
          sVar8 = 0;
          do {
            self->initMagnEst[sVar8] = local_8c8[sVar8] + self->initMagnEst[sVar8];
            sVar8 = sVar8 + 1;
          } while (sVar5 != sVar8);
          goto LAB_001840be;
        }
LAB_0018424f:
        sVar5 = 0;
      }
      else {
        if (sVar5 == 0) goto LAB_0018424f;
LAB_001840be:
        fVar17 = self->overdrive;
        sVar8 = 0;
        do {
          fVar16 = (self->magnPrevProcess[sVar8] / (self->noisePrev[sVar8] + 0.0001)) *
                   self->smooth[sVar8] * 0.98 +
                   (float)((uint)((local_8c8[sVar8] / (self->noise[sVar8] + 0.0001) + -1.0) *
                                 0.01999998) & -(uint)(self->noise[sVar8] < local_8c8[sVar8]));
          afStack_ad8[sVar8] = fVar16 / (fVar17 + fVar16);
          sVar8 = sVar8 + 1;
        } while (sVar5 != sVar8);
        sVar8 = 0;
        do {
          fVar17 = afStack_ad8[sVar8];
          fVar16 = self->denoiseBound;
          fVar18 = fVar16;
          if ((fVar17 < fVar16) || (fVar18 = fVar17, 1.0 < fVar17)) {
            fVar17 = 1.0;
            if (fVar18 <= 1.0) {
              fVar17 = fVar18;
            }
            afStack_ad8[sVar8] = fVar17;
          }
          if (iVar2 < 0x32) {
            fVar18 = (self->initMagnEst[sVar8] - self->overdrive * self->parametricNoise[sVar8]) /
                     (self->initMagnEst[sVar8] + 0.0001);
            if (fVar16 <= fVar18) {
              fVar16 = fVar18;
            }
            fVar18 = 1.0;
            if (fVar16 <= 1.0) {
              fVar18 = fVar16;
            }
            fVar17 = (fVar17 * (float)iVar2 + fVar18 * (float)(0x32 - iVar2)) / 50.0;
            afStack_ad8[sVar8] = fVar17;
          }
          self->smooth[sVar8] = fVar17;
          fVar16 = local_ce8[sVar8];
          afStack_43c[sVar8 + 1] = afStack_43c[sVar8 + 1] * fVar17;
          local_ce8[sVar8] = fVar17 * fVar16;
          sVar8 = sVar8 + 1;
        } while (sVar5 != sVar8);
      }
      memcpy(self->magnPrevProcess,local_8c8,sVar5 * 4);
      memcpy(self->noisePrev,self->noise,sVar5 * 4);
      sVar8 = self->anaLen;
      if (sVar5 * 2 - 2 != sVar8) {
        __assert_fail("time_data_length == 2 * (magnitude_length - 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                      ,0x3a4,
                      "void IFFT(NoiseSuppressionC *, const float *, const float *, size_t, size_t, float *)"
                     );
      }
      local_10e8[0] = afStack_43c[1];
      local_10e8[1] = afStack_43c[sVar5];
      if (1 < sVar5 - 1) {
        lVar4 = 0;
        do {
          local_10e8[lVar4 * 2 + 2] = afStack_43c[lVar4 + 2];
          local_10e8[lVar4 * 2 + 3] = local_ce8[lVar4 + 1];
          lVar4 = lVar4 + 1;
        } while (sVar5 - 2 != lVar4);
      }
      WebRtc_rdft(sVar8,-1,local_10e8,self->ip,self->wfft);
      if (sVar8 != 0) {
        sVar5 = 0;
        do {
          local_10e8[sVar5] = local_10e8[sVar5] * (2.0 / (float)sVar8);
          sVar5 = sVar5 + 1;
        } while (sVar8 != sVar5);
      }
      fVar17 = 1.0;
      if ((self->gainmap == 1) && (200 < self->blockInd)) {
        fVar16 = 0.0;
        fVar17 = 0.0;
        if (self->anaLen != 0) {
          sVar5 = 0;
          do {
            fVar16 = fVar16 + local_10e8[sVar5] * local_10e8[sVar5];
            sVar5 = sVar5 + 1;
            fVar17 = fVar16;
          } while (self->anaLen != sVar5);
        }
        fVar17 = fVar17 / (fVar15 + 1.0);
        if (fVar17 < 0.0) {
          fVar17 = sqrtf(fVar17);
        }
        else {
          fVar17 = SQRT(fVar17);
        }
        fVar16 = 1.0;
        fVar15 = fVar16;
        if ((0.5 < fVar17) && (fVar15 = (fVar17 + -0.5) * 1.3 + 1.0, 1.0 < fVar17 * fVar15)) {
          fVar15 = 1.0 / fVar17;
        }
        if (fVar17 < 0.5) {
          uVar13 = -(uint)(fVar17 <= self->denoiseBound);
          fVar16 = (0.5 - (float)(~uVar13 & (uint)fVar17 | (uint)self->denoiseBound & uVar13)) *
                   -0.3 + 1.0;
        }
        fVar17 = fVar15 * self->priorSpeechProb + (1.0 - self->priorSpeechProb) * fVar16;
      }
      uVar10 = self->anaLen;
      if (uVar10 != 0) {
        pfVar3 = self->window;
        uVar7 = 0;
        do {
          local_10e8[uVar7] = pfVar3[uVar7] * local_10e8[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
        uVar7 = 0;
        do {
          self->syntBuf[uVar7] = local_10e8[uVar7] * fVar17 + self->syntBuf[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
      }
      sVar5 = self->blockLen;
      uVar7 = self->windShift;
      if (uVar7 < uVar7 + sVar5) {
        memcpy(local_6b8,self->syntBuf + uVar7,sVar5 * 4);
      }
      if (uVar10 <= sVar5 * 2 && sVar5 * 2 - uVar10 != 0) {
        memcpy(self->syntBuf,self->syntBuf + sVar5,(uVar10 - sVar5) * 4);
        memset((void *)((long)self + sVar5 * -4 + uVar10 * 4 + 0x838),0,sVar5 * 4);
        sVar5 = self->blockLen;
        if (sVar5 != 0) {
          pfVar3 = *outFrame;
          sVar8 = 0;
          do {
            fVar15 = local_6b8[sVar8];
            fVar17 = 32767.0;
            if ((fVar15 <= 32767.0) && (fVar17 = -32768.0, -32768.0 <= fVar15)) {
              fVar17 = fVar15;
            }
            pfVar3[sVar8] = fVar17;
            sVar8 = sVar8 + 1;
          } while (sVar5 != sVar8);
        }
        if (num_bands < 2) {
          return;
        }
        sVar5 = self->magnLen;
        fVar15 = 0.0;
        uVar7 = (long)(int)~local_1104 + sVar5;
        for (uVar10 = uVar7; uVar10 < sVar5 - 1; uVar10 = uVar10 + 1) {
          fVar15 = fVar15 + self->speechProb[uVar10];
        }
        if (sVar5 == 0) {
          fVar17 = NAN;
        }
        else {
          fVar17 = 0.0;
          sVar8 = 0;
          fVar16 = 0.0;
          do {
            fVar16 = fVar16 + self->magnPrevAnalyze[sVar8];
            fVar17 = fVar17 + self->magnPrevProcess[sVar8];
            sVar8 = sVar8 + 1;
          } while (sVar5 != sVar8);
          fVar17 = fVar17 / fVar16;
        }
        fVar17 = (fVar15 / (float)(int)local_1104) * fVar17;
        fVar15 = 0.0;
        for (; uVar7 < sVar5 - 1; uVar7 = uVar7 + 1) {
          fVar15 = fVar15 + self->smooth[uVar7];
        }
        fVar15 = fVar15 / (float)(int)local_1104;
        dVar14 = tanh((double)(fVar17 + fVar17 + -1.0));
        fVar16 = ((float)dVar14 + 1.0) * 0.5;
        fVar17 = (float)(~-(uint)(fVar17 < 0.5) & (uint)(fVar16 * 0.25 + fVar15 * 0.75) |
                        (uint)(fVar16 * 0.5 + fVar15 * 0.5) & -(uint)(fVar17 < 0.5));
        fVar15 = self->denoiseBound;
        if (self->denoiseBound <= fVar17) {
          fVar15 = fVar17;
        }
        fVar17 = 1.0;
        if (fVar15 <= 1.0) {
          fVar17 = fVar15;
        }
        sVar5 = self->blockLen;
        pafVar9 = self->dataBufHB;
        uVar10 = 0;
        do {
          if (sVar5 != 0) {
            pfVar3 = ppfVar12[uVar10];
            sVar8 = 0;
            do {
              fVar16 = (*pafVar9)[sVar8] * fVar17;
              fVar15 = 32767.0;
              if ((fVar16 <= 32767.0) && (fVar15 = -32768.0, -32768.0 <= fVar16)) {
                fVar15 = fVar16;
              }
              pfVar3[sVar8] = fVar15;
              sVar8 = sVar8 + 1;
            } while (sVar5 != sVar8);
          }
          uVar10 = uVar10 + 1;
          pafVar9 = pafVar9 + 1;
        } while (uVar10 != uVar1);
        return;
      }
      goto LAB_00184764;
    }
  }
  sVar5 = self->blockLen;
  uVar7 = self->windShift;
  if (uVar7 < uVar7 + sVar5) {
    memcpy(local_6b8,self->syntBuf + uVar7,sVar5 * 4);
  }
  if (uVar10 <= sVar5 * 2 && sVar5 * 2 - uVar10 != 0) {
    memcpy(self->syntBuf,self->syntBuf + sVar5,(uVar10 - sVar5) * 4);
    memset((void *)((long)self + sVar5 * -4 + uVar10 * 4 + 0x838),0,sVar5 * 4);
    sVar5 = self->blockLen;
    if (sVar5 != 0) {
      pfVar3 = *outFrame;
      sVar8 = 0;
      do {
        fVar15 = local_6b8[sVar8];
        fVar17 = 32767.0;
        if ((fVar15 <= 32767.0) && (fVar17 = -32768.0, -32768.0 <= fVar15)) {
          fVar17 = fVar15;
        }
        pfVar3[sVar8] = fVar17;
        sVar8 = sVar8 + 1;
      } while (sVar5 != sVar8);
    }
    if (1 < num_bands) {
      pafVar9 = self->dataBufHB;
      uVar10 = 0;
      do {
        if (sVar5 != 0) {
          pfVar3 = ppfVar12[uVar10];
          sVar8 = 0;
          do {
            fVar15 = (*pafVar9)[sVar8];
            fVar17 = 32767.0;
            if ((fVar15 <= 32767.0) && (fVar17 = -32768.0, -32768.0 <= fVar15)) {
              fVar17 = fVar15;
            }
            pfVar3[sVar8] = fVar17;
            sVar8 = sVar8 + 1;
          } while (sVar5 != sVar8);
        }
        uVar10 = uVar10 + 1;
        pafVar9 = pafVar9 + 1;
      } while (uVar10 != uVar1);
    }
    return;
  }
LAB_00184764:
  __assert_fail("buffer_length < 2 * frame_length",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                ,0x35c,"void UpdateBuffer(const float *, size_t, size_t, float *)");
}

Assistant:

void WebRtcNs_ProcessCore(NoiseSuppressionC* self,
                          const float* const* speechFrame,
                          size_t num_bands,
                          float* const* outFrame) {
  // Main routine for noise reduction.
  int flagHB = 0;
  size_t i, j;

  float energy1, energy2, gain, factor, factor1, factor2;
  float fout[BLOCKL_MAX];
  float winData[ANAL_BLOCKL_MAX];
  float magn[HALF_ANAL_BLOCKL];
  float theFilter[HALF_ANAL_BLOCKL], theFilterTmp[HALF_ANAL_BLOCKL];
  float real[ANAL_BLOCKL_MAX], imag[HALF_ANAL_BLOCKL];

  // SWB variables.
  int deltaBweHB = 1;
  int deltaGainHB = 1;
  float decayBweHB = 1.0;
  float gainMapParHB = 1.0;
  float gainTimeDomainHB = 1.0;
  float avgProbSpeechHB, avgProbSpeechHBTmp, avgFilterGainHB, gainModHB;
  float sumMagnAnalyze, sumMagnProcess;

  // Check that initiation has been done.
  assert(self->initFlag == 1);
  assert((num_bands - 1) <= NUM_HIGH_BANDS_MAX);

  const float* const* speechFrameHB = NULL;
  float* const* outFrameHB = NULL;
  size_t num_high_bands = 0;
  if (num_bands > 1) {
    speechFrameHB = &speechFrame[1];
    outFrameHB = &outFrame[1];
    num_high_bands = num_bands - 1;
    flagHB = 1;
    // Range for averaging low band quantities for H band gain.
    deltaBweHB = (int)self->magnLen / 4;
    deltaGainHB = deltaBweHB;
  }

  // Update analysis buffer for L band.
  UpdateBuffer(speechFrame[0], self->blockLen, self->anaLen, self->dataBuf);

  if (flagHB == 1) {
    // Update analysis buffer for H bands.
    for (i = 0; i < num_high_bands; ++i) {
      UpdateBuffer(speechFrameHB[i],
                   self->blockLen,
                   self->anaLen,
                   self->dataBufHB[i]);
    }
  }

  Windowing(self->window, self->dataBuf, self->anaLen, winData);
  energy1 = Energy(winData, self->anaLen);
  if (energy1 == 0.0) {
    // Synthesize the special case of zero input.
    // Read out fully processed segment.
    for (i = self->windShift; i < self->blockLen + self->windShift; i++) {
      fout[i - self->windShift] = self->syntBuf[i];
    }
    // Update synthesis buffer.
    UpdateBuffer(NULL, self->blockLen, self->anaLen, self->syntBuf);

    for (i = 0; i < self->blockLen; ++i)
      outFrame[0][i] =
          WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX, fout[i], WEBRTC_SPL_WORD16_MIN);

    // For time-domain gain of HB.
    if (flagHB == 1) {
      for (i = 0; i < num_high_bands; ++i) {
        for (j = 0; j < self->blockLen; ++j) {
          outFrameHB[i][j] = WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX,
                                            self->dataBufHB[i][j],
                                            WEBRTC_SPL_WORD16_MIN);
        }
      }
    }

    return;
  }

  FFT(self, winData, self->anaLen, self->magnLen, real, imag, magn);

  if (self->blockInd < END_STARTUP_SHORT) {
    for (i = 0; i < self->magnLen; i++) {
      self->initMagnEst[i] += magn[i];
    }
  }

  ComputeDdBasedWienerFilter(self, magn, theFilter);

  for (i = 0; i < self->magnLen; i++) {
    // Flooring bottom.
    if (theFilter[i] < self->denoiseBound) {
      theFilter[i] = self->denoiseBound;
    }
    // Flooring top.
    if (theFilter[i] > 1.f) {
      theFilter[i] = 1.f;
    }
    if (self->blockInd < END_STARTUP_SHORT) {
      theFilterTmp[i] =
          (self->initMagnEst[i] - self->overdrive * self->parametricNoise[i]);
      theFilterTmp[i] /= (self->initMagnEst[i] + 0.0001f);
      // Flooring bottom.
      if (theFilterTmp[i] < self->denoiseBound) {
        theFilterTmp[i] = self->denoiseBound;
      }
      // Flooring top.
      if (theFilterTmp[i] > 1.f) {
        theFilterTmp[i] = 1.f;
      }
      // Weight the two suppression filters.
      theFilter[i] *= (self->blockInd);
      theFilterTmp[i] *= (END_STARTUP_SHORT - self->blockInd);
      theFilter[i] += theFilterTmp[i];
      theFilter[i] /= (END_STARTUP_SHORT);
    }

    self->smooth[i] = theFilter[i];
    real[i] *= self->smooth[i];
    imag[i] *= self->smooth[i];
  }
  // Keep track of |magn| spectrum for next frame.
  memcpy(self->magnPrevProcess, magn, sizeof(*magn) * self->magnLen);
  memcpy(self->noisePrev, self->noise, sizeof(self->noise[0]) * self->magnLen);
  // Back to time domain.
  IFFT(self, real, imag, self->magnLen, self->anaLen, winData);

  // Scale factor: only do it after END_STARTUP_LONG time.
  factor = 1.f;
  if (self->gainmap == 1 && self->blockInd > END_STARTUP_LONG) {
    factor1 = 1.f;
    factor2 = 1.f;

    energy2 = Energy(winData, self->anaLen);
    gain = (float)sqrt(energy2 / (energy1 + 1.f));

    // Scaling for new version.
    if (gain > B_LIM) {
      factor1 = 1.f + 1.3f * (gain - B_LIM);
      if (gain * factor1 > 1.f) {
        factor1 = 1.f / gain;
      }
    }
    if (gain < B_LIM) {
      // Don't reduce scale too much for pause regions:
      // attenuation here should be controlled by flooring.
      if (gain <= self->denoiseBound) {
        gain = self->denoiseBound;
      }
      factor2 = 1.f - 0.3f * (B_LIM - gain);
    }
    // Combine both scales with speech/noise prob:
    // note prior (priorSpeechProb) is not frequency dependent.
    factor = self->priorSpeechProb * factor1 +
             (1.f - self->priorSpeechProb) * factor2;
  }  // Out of self->gainmap == 1.

  Windowing(self->window, winData, self->anaLen, winData);

  // Synthesis.
  for (i = 0; i < self->anaLen; i++) {
    self->syntBuf[i] += factor * winData[i];
  }
  // Read out fully processed segment.
  for (i = self->windShift; i < self->blockLen + self->windShift; i++) {
    fout[i - self->windShift] = self->syntBuf[i];
  }
  // Update synthesis buffer.
  UpdateBuffer(NULL, self->blockLen, self->anaLen, self->syntBuf);

  for (i = 0; i < self->blockLen; ++i)
    outFrame[0][i] =
        WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX, fout[i], WEBRTC_SPL_WORD16_MIN);

  // For time-domain gain of HB.
  if (flagHB == 1) {
    // Average speech prob from low band.
    // Average over second half (i.e., 4->8kHz) of frequencies spectrum.
    avgProbSpeechHB = 0.0;
    for (i = self->magnLen - deltaBweHB - 1; i < self->magnLen - 1; i++) {
      avgProbSpeechHB += self->speechProb[i];
    }
    avgProbSpeechHB = avgProbSpeechHB / ((float)deltaBweHB);
    // If the speech was suppressed by a component between Analyze and
    // Process, for example the AEC, then it should not be considered speech
    // for high band suppression purposes.
    sumMagnAnalyze = 0;
    sumMagnProcess = 0;
    for (i = 0; i < self->magnLen; ++i) {
      sumMagnAnalyze += self->magnPrevAnalyze[i];
      sumMagnProcess += self->magnPrevProcess[i];
    }
    avgProbSpeechHB *= sumMagnProcess / sumMagnAnalyze;
    // Average filter gain from low band.
    // Average over second half (i.e., 4->8kHz) of frequencies spectrum.
    avgFilterGainHB = 0.0;
    for (i = self->magnLen - deltaGainHB - 1; i < self->magnLen - 1; i++) {
      avgFilterGainHB += self->smooth[i];
    }
    avgFilterGainHB = avgFilterGainHB / ((float)(deltaGainHB));
    avgProbSpeechHBTmp = 2.f * avgProbSpeechHB - 1.f;
    // Gain based on speech probability.
    gainModHB = 0.5f * (1.f + (float)tanh(gainMapParHB * avgProbSpeechHBTmp));
    // Combine gain with low band gain.
    gainTimeDomainHB = 0.5f * gainModHB + 0.5f * avgFilterGainHB;
    if (avgProbSpeechHB >= 0.5f) {
      gainTimeDomainHB = 0.25f * gainModHB + 0.75f * avgFilterGainHB;
    }
    gainTimeDomainHB = gainTimeDomainHB * decayBweHB;
    // Make sure gain is within flooring range.
    // Flooring bottom.
    if (gainTimeDomainHB < self->denoiseBound) {
      gainTimeDomainHB = self->denoiseBound;
    }
    // Flooring top.
    if (gainTimeDomainHB > 1.f) {
      gainTimeDomainHB = 1.f;
    }
    // Apply gain.
    for (i = 0; i < num_high_bands; ++i) {
      for (j = 0; j < self->blockLen; j++) {
        outFrameHB[i][j] =
            WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX,
                           gainTimeDomainHB * self->dataBufHB[i][j],
                           WEBRTC_SPL_WORD16_MIN);
      }
    }
  }  // End of H band gain computation.
}